

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void chrono::Transform_Cq_to_Cqw_row
               (ChMatrixNM<double,_7,_BODY_QDOF> *mCq,int qrow,ChMatrixRef *mCqw,int qwrow,
               ChGlMatrix34<double> *Gl)

{
  PointerType pdVar1;
  undefined1 auVar2 [16];
  PointerType pdVar3;
  double dVar4;
  long lVar5;
  char *__function;
  long lVar6;
  long lVar7;
  double *pdVar8;
  int col;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if ((uint)qrow < 7) {
    if (((-1 < qwrow) &&
        (lVar5 = (long)qwrow,
        lVar5 < (mCqw->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value)) &&
       (2 < (mCqw->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value)) {
      pdVar8 = (mCq->super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>).m_storage.m_data.
               array + (long)qrow * 7;
      pdVar3 = (mCqw->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      dVar4 = pdVar8[1];
      lVar6 = (mCqw->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value * lVar5;
      pdVar1 = pdVar3 + lVar6;
      *pdVar1 = *pdVar8;
      pdVar1[1] = dVar4;
      pdVar3[lVar6 + 2] = pdVar8[2];
      lVar7 = 0;
      lVar6 = (mCqw->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      while( true ) {
        auVar10 = ZEXT816(0) << 0x40;
        lVar9 = 0;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = pdVar8[lVar9 + 3];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(double *)((long)Gl + lVar9 * 8);
          auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar2);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        if ((lVar6 <= lVar5) ||
           (lVar9 = lVar7 + 3,
           (mCqw->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_cols.m_value <= lVar9)) break;
        lVar7 = lVar7 + 1;
        Gl = (ChGlMatrix34<double> *)((long)Gl + 0x20);
        (mCqw->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data[lVar9 + (mCqw->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        ).m_stride.m_outer.m_value * lVar5] = auVar10._0_8_ * 0.25;
        if (lVar7 == 3) {
          return;
        }
      }
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                   );
    }
    __function = 
    "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
    ;
  }
  else {
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, 7, 7, 1>, 1, 3>::Block(XprType &, Index, Index) [XprType = const Eigen::Matrix<double, 7, 7, 1>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
}

Assistant:

void Transform_Cq_to_Cqw_row(const ChMatrixNM<double, 7, BODY_QDOF>& mCq, int qrow, ChMatrixRef mCqw, int qwrow, const ChGlMatrix34<>& Gl) {
    // translational part - not changed
    mCqw.block<1, 3>(qwrow, 0) = mCq.block<1, 3>(qrow, 0);

    // rotational part [Cq_w] = [Cq_q]*[Gl]'*1/4
    for (int colres = 0; colres < 3; colres++) {
        double sum = 0;
        for (int col = 0; col < 4; col++) {
            sum += mCq(qrow, col + 3) * Gl(colres, col);
        }
        mCqw(qwrow, colres + 3) = sum * 0.25;
    }
    //// RADU: explicit loop slightly more performant than Eigen expressions
    ////mCqw.block<1, 3>(qwrow, 3) = 0.25 * mCq.block<1, 4>(qrow, 3) * Gl.transpose();
}